

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

int Abc_NtkMfsResubNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_ObjFanin(pNode,local_2c);
    iVar1 = Abc_ObjIsCi(pAVar2);
    if (((iVar1 == 0) && (iVar1 = Abc_ObjFanoutNum(pAVar2), iVar1 == 1)) &&
       (iVar1 = Abc_NtkMfsSolveSatResub(p,pNode,local_2c,0,0), iVar1 != 0)) {
      return 1;
    }
  }
  if (p->pPars->fArea == 0) {
    for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_ObjFanin(pNode,local_2c);
      iVar1 = Abc_ObjIsCi(pAVar2);
      if (((iVar1 != 0) || (iVar1 = Abc_ObjFanoutNum(pAVar2), iVar1 != 1)) &&
         (iVar1 = Abc_NtkMfsSolveSatResub(p,pNode,local_2c,1,0), iVar1 != 0)) {
        return 1;
      }
    }
  }
  Abc_ObjFaninNum(pNode);
  return 0;
}

Assistant:

int Abc_NtkMfsResubNode( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i;
    // try replacing area critical fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        }
    // try removing redundant edges
    if ( !p->pPars->fArea )
    {
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( Abc_ObjIsCi(pFanin) || Abc_ObjFanoutNum(pFanin) != 1 )
            {
                if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                    return 1;
            }
    }
    if ( Abc_ObjFaninNum(pNode) == p->nFaninMax )
        return 0;
/*
    // try replacing area critical fanins while adding two new fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
                return 1;
        }
*/
    return 0;
}